

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

bool __thiscall OpenMD::MoleculeStamp::addBondStamp(MoleculeStamp *this,BondStamp *bond)

{
  BondStamp *local_8;
  
  local_8 = bond;
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::push_back
            (&this->bondStamps_,&local_8);
  return true;
}

Assistant:

bool MoleculeStamp::addBondStamp(BondStamp* bond) {
    bondStamps_.push_back(bond);
    return true;
  }